

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

wasm_trap_t * fail_callback(void *env,wasm_val_vec_t *args,wasm_val_vec_t *results)

{
  wasm_trap_t *pwVar1;
  wasm_name_t message;
  
  puts("Calling back...");
  wasm_byte_vec_new(&message,0xf,"callback abort");
  pwVar1 = (wasm_trap_t *)wasm_trap_new(env,&message);
  wasm_byte_vec_delete(&message);
  return pwVar1;
}

Assistant:

own wasm_trap_t* fail_callback(
  void* env, const wasm_val_vec_t* args, wasm_val_vec_t* results
) {
  printf("Calling back...\n");
  own wasm_name_t message;
  wasm_name_new_from_string_nt(&message, "callback abort");
  own wasm_trap_t* trap = wasm_trap_new((wasm_store_t*)env, &message);
  wasm_name_delete(&message);
  return trap;
}